

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O1

uint32_t ivk::cmd_set_ret(void *el)

{
  XMLError XVar1;
  uint32_t uVar2;
  XMLAttribute *this;
  int ret;
  uint32_t local_c;
  
  if (el == (void *)0x0) {
    uVar2 = 2;
  }
  else {
    local_c = 0;
    this = tinyxml2::XMLElement::FindAttribute(*el,"value");
    uVar2 = 5;
    if (this != (XMLAttribute *)0x0) {
      XVar1 = tinyxml2::XMLAttribute::QueryIntValue(this,(int *)&local_c);
      if (XVar1 == XML_NO_ERROR) {
        uVar2 = setret(local_c);
      }
    }
  }
  return uVar2;
}

Assistant:

uint32_t ivk::cmd_set_ret(void *el) {
    if(!el){
        return proc_param_err;
    }
    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;
    int ret=0;
    XMLError er = pEl->QueryIntAttribute("value",&ret);
    if(er!=XML_NO_ERROR){
        return proc_xml_err;
    }

    return ivk::setret((uint32_t)ret);
}